

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsHexUpper<unsigned_char>
          (IntDigits *this,uchar v)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    this->storage_[lVar3 + 0x2b] = "0123456789ABCDEF"[v & 0xf];
    bVar1 = 0xf < v;
    lVar2 = lVar3 + -1;
    v = v >> 4;
  } while (bVar1);
  this->start_ = this->storage_ + lVar3 + 0x2b;
  this->size_ = -(lVar3 + -1);
  return;
}

Assistant:

void PrintAsHexUpper(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    // kHexTable is only lowercase, so do it manually for uppercase.
    do {
      *--p = "0123456789ABCDEF"[static_cast<size_t>(v) & 15];
      v >>= 4;
    } while (v);
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }